

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void __thiscall my_crc_basic::process_bit(my_crc_basic *this,bool bit)

{
  uint uVar1;
  uint local_1c;
  bool do_poly_div;
  bool bit_local;
  my_crc_basic *this_local;
  
  if (bit) {
    local_1c = this->high_bit_mask;
  }
  else {
    local_1c = 0;
  }
  this->rem_ = local_1c ^ this->rem_;
  uVar1 = this->rem_;
  this->rem_ = this->rem_ << 1;
  if ((uVar1 & this->high_bit_mask) != 0) {
    this->rem_ = this->poly_ ^ this->rem_;
  }
  return;
}

Assistant:

void my_crc_basic::process_bit (bool bit) {

  // compare the new bit with the remainder's highest
  rem_ ^= ( bit ? high_bit_mask : 0u );

  // a full polynominal division step is done when the highest bit is one
  bool const  do_poly_div = static_cast<bool>( rem_ & high_bit_mask );
  
  // shift out the highest bit
  rem_ <<= 1;
  
  // carry out the division, if needed
  if ( do_poly_div ) rem_ ^= poly_;
 
}